

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O1

void __thiscall hypermind::Lexer::Consume(Lexer *this,TokenType type)

{
  TokenType TVar1;
  
  TVar1 = PeekTokenType(this);
  if (TVar1 == type) {
    Consume(this);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout," missing token :  ",0x12);
  DumpTokenType((Ostream *)&std::cout,type);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  return;
}

Assistant:

void Lexer::Consume(TokenType type) {
        if (PeekTokenType() == type)
            Consume();
        else {
            hm_cout << _HM_C(" missing token :  ");
            DumpTokenType(hm_cout, type);
            hm_cout << std::endl;
        }
    }